

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

LY_ERR lyxml_next_attribute
                 (lyxml_ctx *xmlctx,char **prefix,size_t *prefix_len,char **name,size_t *name_len)

{
  ly_ctx *ctx;
  LY_ERR LVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  LY_ERR ret___1;
  LY_ERR ret__;
  ly_bool dynamic;
  ly_bool ws_only;
  size_t value_len;
  size_t parsed;
  char *pcStack_48;
  uint32_t c;
  char *value;
  char *in;
  size_t *name_len_local;
  char **name_local;
  size_t *prefix_len_local;
  char **prefix_local;
  lyxml_ctx *xmlctx_local;
  
  in = (char *)name_len;
  name_len_local = (size_t *)name;
  name_local = (char **)prefix_len;
  prefix_len_local = (size_t *)prefix;
  prefix_local = (char **)xmlctx;
  while( true ) {
    bVar4 = true;
    if (((**(char **)(prefix_local[1] + 8) != ' ') &&
        (bVar4 = true, **(char **)(prefix_local[1] + 8) != '\t')) &&
       (bVar4 = true, **(char **)(prefix_local[1] + 8) != '\n')) {
      bVar4 = **(char **)(prefix_local[1] + 8) == '\r';
    }
    if (!bVar4) break;
    if (**(char **)(prefix_local[1] + 8) == '\n') {
      *(long *)(prefix_local[1] + 0x38) = *(long *)(prefix_local[1] + 0x38) + 1;
    }
    ly_in_skip((ly_in *)prefix_local[1],1);
  }
  while( true ) {
    bVar4 = false;
    if (**(char **)(prefix_local[1] + 8) != '>') {
      bVar4 = **(char **)(prefix_local[1] + 8) != '/';
    }
    if (!bVar4) {
      return LY_SUCCESS;
    }
    value = *(char **)(prefix_local[1] + 8);
    if (*value == '\0') {
      ly_vlog((ly_ctx *)*prefix_local,(char *)0x0,LYVE_SYNTAX,"Unexpected end-of-input.");
      return LY_EVALID;
    }
    LVar1 = ly_getutf8(&value,(uint32_t *)((long)&parsed + 4),&value_len);
    if ((LVar1 != LY_SUCCESS) ||
       (((((((parsed._4_4_ < 0x61 || (0x7a < parsed._4_4_)) &&
            ((parsed._4_4_ != 0x5f && ((parsed._4_4_ < 0x41 || (0x5a < parsed._4_4_)))))) &&
           ((parsed._4_4_ < 0x370 || ((0x1fff < parsed._4_4_ || (parsed._4_4_ == 0x37e)))))) &&
          (((parsed._4_4_ < 0xc0 ||
            (((0x2ff < parsed._4_4_ || (parsed._4_4_ == 0xd7)) || (parsed._4_4_ == 0xf7)))) &&
           ((parsed._4_4_ != 0x200c && (parsed._4_4_ != 0x200d)))))) &&
         ((parsed._4_4_ < 0x2070 || (0x218f < parsed._4_4_)))) &&
        ((((parsed._4_4_ < 0x2c00 || (0x2fef < parsed._4_4_)) &&
          ((parsed._4_4_ < 0x3001 || (0xd7ff < parsed._4_4_)))) &&
         ((((parsed._4_4_ < 0xf900 || (0xfdcf < parsed._4_4_)) &&
           ((parsed._4_4_ < 0xfdf0 || (0xfffd < parsed._4_4_)))) &&
          ((parsed._4_4_ < 0x10000 || (0xeffff < parsed._4_4_)))))))))) break;
    LVar1 = lyxml_parse_qname((lyxml_ctx *)prefix_local,(char **)prefix_len_local,
                              (size_t *)name_local,(char **)name_len_local,(size_t *)in);
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    if ((*prefix_len_local == 0) ||
       (iVar3 = ly_strncmp("xmlns",(char *)*prefix_len_local,(size_t)*name_local), iVar3 != 0)) {
      if (*prefix_len_local != 0) {
        return LY_SUCCESS;
      }
      iVar3 = ly_strncmp("xmlns",(char *)*name_len_local,*(size_t *)in);
      if (iVar3 != 0) {
        return LY_SUCCESS;
      }
    }
    LVar1 = lyxml_next_attr_content
                      ((lyxml_ctx *)prefix_local,&stack0xffffffffffffffb8,(size_t *)&ret__,
                       (byte *)((long)&ret___1 + 3),(byte *)((long)&ret___1 + 2));
    if (LVar1 != LY_SUCCESS) {
      return LVar1;
    }
    if (ret___1._2_1_ != LY_SUCCESS >> 0x10) {
      free(pcStack_48);
    }
    while( true ) {
      bVar4 = true;
      if (((**(char **)(prefix_local[1] + 8) != ' ') &&
          (bVar4 = true, **(char **)(prefix_local[1] + 8) != '\t')) &&
         (bVar4 = true, **(char **)(prefix_local[1] + 8) != '\n')) {
        bVar4 = **(char **)(prefix_local[1] + 8) == '\r';
      }
      if (!bVar4) break;
      if (**(char **)(prefix_local[1] + 8) == '\n') {
        *(long *)(prefix_local[1] + 0x38) = *(long *)(prefix_local[1] + 0x38) + 1;
      }
      ly_in_skip((ly_in *)prefix_local[1],1);
    }
  }
  ctx = (ly_ctx *)*prefix_local;
  uVar2 = LY_VCODE_INSTREXP_len(value + -value_len);
  ly_vlog(ctx,(char *)0x0,LYVE_SYNTAX,"Invalid character sequence \"%.*s\", expected %s.",
          (ulong)uVar2,(long)value - value_len,"element tag end (\'>\' or \'/>\') or an attribute");
  return LY_EVALID;
}

Assistant:

static LY_ERR
lyxml_next_attribute(struct lyxml_ctx *xmlctx, const char **prefix, size_t *prefix_len, const char **name, size_t *name_len)
{
    const char *in;
    char *value;
    uint32_t c;
    size_t parsed, value_len;
    ly_bool ws_only, dynamic;

    /* skip WS */
    ign_xmlws(xmlctx);

    /* parse only possible attributes */
    while ((xmlctx->in->current[0] != '>') && (xmlctx->in->current[0] != '/')) {
        in = xmlctx->in->current;
        if (in[0] == '\0') {
            LOGVAL(xmlctx->ctx, LY_VCODE_EOF);
            return LY_EVALID;
        } else if ((ly_getutf8(&in, &c, &parsed) || !is_xmlqnamestartchar(c))) {
            LOGVAL(xmlctx->ctx, LY_VCODE_INSTREXP, LY_VCODE_INSTREXP_len(in - parsed), in - parsed,
                    "element tag end ('>' or '/>') or an attribute");
            return LY_EVALID;
        }

        /* parse attribute name */
        LY_CHECK_RET(lyxml_parse_qname(xmlctx, prefix, prefix_len, name, name_len));

        if ((!*prefix || ly_strncmp("xmlns", *prefix, *prefix_len)) && (*prefix || ly_strncmp("xmlns", *name, *name_len))) {
            /* standard attribute */
            break;
        }

        /* namespace, skip it */
        LY_CHECK_RET(lyxml_next_attr_content(xmlctx, (const char **)&value, &value_len, &ws_only, &dynamic));
        if (dynamic) {
            free(value);
        }

        /* skip WS */
        ign_xmlws(xmlctx);
    }

    return LY_SUCCESS;
}